

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if2ip.c
# Opt level: O0

uint Curl_ipv6_scope(sockaddr *sa)

{
  ushort uVar1;
  ushort uVar2;
  unsigned_short w;
  uchar *b;
  sockaddr_in6 *sa6;
  sockaddr *sa_local;
  
  if (sa->sa_family == 10) {
    uVar1 = CONCAT11(sa->sa_data[6],sa->sa_data[7]);
    if ((sa->sa_data[6] & 0xfeU) == 0xfc) {
      return 3;
    }
    uVar2 = uVar1 & 0xffc0;
    if ((uVar1 & 0xffc0) == 0) {
      if ((((((((((((((sa->sa_data[7] == '\0' && sa->sa_data[8] == '\0') && sa->sa_data[9] == '\0')
                    && sa->sa_data[10] == '\0') && sa->sa_data[0xb] == '\0') &&
                  sa->sa_data[0xc] == '\0') && sa->sa_data[0xd] == '\0') &&
                (char)sa[1].sa_family == '\0') && *(char *)((long)&sa[1].sa_family + 1) == '\0') &&
              sa[1].sa_data[0] == '\0') && sa[1].sa_data[1] == '\0') && sa[1].sa_data[2] == '\0') &&
           sa[1].sa_data[3] == '\0') && sa[1].sa_data[4] == '\0') && (sa[1].sa_data[5] == '\x01')) {
        return 4;
      }
    }
    else {
      if (uVar2 == 0xfe80) {
        return 1;
      }
      if (uVar2 == 0xfec0) {
        return 2;
      }
    }
  }
  return 0;
}

Assistant:

unsigned int Curl_ipv6_scope(const struct sockaddr *sa)
{
  if(sa->sa_family == AF_INET6) {
    const struct sockaddr_in6 * sa6 =
      (const struct sockaddr_in6 *)(const void *) sa;
    const unsigned char *b = sa6->sin6_addr.s6_addr;
    unsigned short w = (unsigned short) ((b[0] << 8) | b[1]);

    if((b[0] & 0xFE) == 0xFC) /* Handle ULAs */
      return IPV6_SCOPE_UNIQUELOCAL;
    switch(w & 0xFFC0) {
    case 0xFE80:
      return IPV6_SCOPE_LINKLOCAL;
    case 0xFEC0:
      return IPV6_SCOPE_SITELOCAL;
    case 0x0000:
      w = b[1] | b[2] | b[3] | b[4] | b[5] | b[6] | b[7] | b[8] | b[9] |
          b[10] | b[11] | b[12] | b[13] | b[14];
      if(w || b[15] != 0x01)
        break;
      return IPV6_SCOPE_NODELOCAL;
    default:
      break;
    }
  }
  return IPV6_SCOPE_GLOBAL;
}